

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRenderTests.cpp
# Opt level: O0

void deqp::egl::anon_unknown_4::renderReference
               (PixelBufferAccess *dst,
               vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
               *drawOps,PixelFormat *colorBits,int depthBits,int stencilBits,int numSamples)

{
  bool bVar1;
  int height_00;
  int depth;
  reference drawOp_00;
  pointer pDVar2;
  FragmentShader *local_6d8;
  VertexAttrib *local_6a8;
  PixelBufferAccess local_6a0;
  MultisamplePixelBufferAccess local_678;
  MultisampleConstPixelBufferAccess local_650;
  DrawPrimitiveOp *local_628;
  PrimitiveList local_620;
  Program local_600;
  DrawCommand local_5e8;
  PixelBufferAccess local_5b8;
  MultisamplePixelBufferAccess local_590;
  MultisampleConstPixelBufferAccess local_568;
  ViewportState local_53c;
  undefined1 local_524 [8];
  RenderState renderState;
  __normal_iterator<const_deqp::egl::(anonymous_namespace)::DrawPrimitiveOp_*,_std::vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>_>
  local_438;
  const_iterator drawOp;
  MultisamplePixelBufferAccess local_408;
  PixelBufferAccess local_3e0;
  MultisamplePixelBufferAccess local_3b8;
  PixelBufferAccess local_390;
  MultisamplePixelBufferAccess local_368;
  undefined1 local_340 [8];
  RenderTarget renderTarget;
  PixelBufferAccess local_238;
  TextureFormat local_210;
  WindowRectangle local_208;
  PixelBufferAccess local_1f8;
  TextureFormat local_1d0;
  WindowRectangle local_1c8;
  PixelBufferAccess local_1b8;
  TextureFormat local_190;
  undefined1 local_188 [8];
  ReferenceShader shader;
  VertexAttrib attributes [2];
  undefined1 local_c0 [7];
  Renderer referenceRenderer;
  TextureLevel stencilBuffer;
  undefined1 local_88 [8];
  TextureLevel depthBuffer;
  TextureLevel colorBuffer;
  int height;
  int width;
  int numSamples_local;
  int stencilBits_local;
  int depthBits_local;
  PixelFormat *colorBits_local;
  vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
  *drawOps_local;
  PixelBufferAccess *dst_local;
  
  height_00 = tcu::ConstPixelBufferAccess::getWidth(&dst->super_ConstPixelBufferAccess);
  depth = tcu::ConstPixelBufferAccess::getHeight(&dst->super_ConstPixelBufferAccess);
  tcu::TextureLevel::TextureLevel((TextureLevel *)&depthBuffer.m_data.m_cap);
  tcu::TextureLevel::TextureLevel((TextureLevel *)local_88);
  tcu::TextureLevel::TextureLevel((TextureLevel *)local_c0);
  rr::Renderer::Renderer((Renderer *)((long)&attributes[1].generic.v + 0xf));
  local_6a8 = (VertexAttrib *)
              &shader.super_FragmentShader.m_outputs.
               super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
  do {
    rr::VertexAttrib::VertexAttrib(local_6a8);
    local_6a8 = local_6a8 + 1;
  } while (local_6a8 != (VertexAttrib *)((long)&attributes[1].generic.v + 8));
  ReferenceShader::ReferenceShader((ReferenceShader *)local_188);
  shader.super_FragmentShader.m_outputs.
  super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  shader.super_FragmentShader.m_outputs.
  super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 4;
  attributes[0].type = VERTEXATTRIBTYPE_FLOAT;
  attributes[0].size = 0;
  attributes[0].generic.v.uData[2] = 0;
  attributes[0].generic.v.uData[3] = 4;
  attributes[1].type = VERTEXATTRIBTYPE_FLOAT;
  attributes[1].size = 0;
  local_190 = getColorFormat(colorBits);
  tcu::TextureLevel::setStorage
            ((TextureLevel *)&depthBuffer.m_data.m_cap,&local_190,numSamples,height_00,depth);
  tcu::PixelBufferAccess::PixelBufferAccess(&local_1b8,(TextureLevel *)&depthBuffer.m_data.m_cap);
  rr::WindowRectangle::WindowRectangle(&local_1c8,0,0,height_00,depth);
  rr::clearMultisampleColorBuffer(&local_1b8,(Vec4 *)CLEAR_COLOR,&local_1c8);
  if (0 < depthBits) {
    local_1d0 = getDepthFormat(depthBits);
    tcu::TextureLevel::setStorage((TextureLevel *)local_88,&local_1d0,numSamples,height_00,depth);
    tcu::PixelBufferAccess::PixelBufferAccess(&local_1f8,(TextureLevel *)local_88);
    rr::WindowRectangle::WindowRectangle(&local_208,0,0,height_00,depth);
    rr::clearMultisampleDepthBuffer(&local_1f8,1.0,&local_208);
  }
  if (0 < stencilBits) {
    local_210 = getStencilFormat(stencilBits);
    tcu::TextureLevel::setStorage((TextureLevel *)local_c0,&local_210,numSamples,height_00,depth);
    tcu::PixelBufferAccess::PixelBufferAccess(&local_238,(TextureLevel *)local_c0);
    rr::WindowRectangle::WindowRectangle
              ((WindowRectangle *)
               &renderTarget.m_stencilBuffer.m_access.super_ConstPixelBufferAccess.m_data,0,0,
               height_00,depth);
    rr::clearMultisampleStencilBuffer
              (&local_238,0,
               (WindowRectangle *)
               &renderTarget.m_stencilBuffer.m_access.super_ConstPixelBufferAccess.m_data);
  }
  tcu::TextureLevel::getAccess(&local_390,(TextureLevel *)&depthBuffer.m_data.m_cap);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_368,&local_390);
  tcu::TextureLevel::getAccess(&local_3e0,(TextureLevel *)local_88);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_3b8,&local_3e0);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&drawOp,(TextureLevel *)local_c0);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_408,(PixelBufferAccess *)&drawOp);
  rr::RenderTarget::RenderTarget((RenderTarget *)local_340,&local_368,&local_3b8,&local_408);
  local_438._M_current =
       (DrawPrimitiveOp *)
       std::
       vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
       ::begin(drawOps);
  while( true ) {
    renderState._220_8_ =
         std::
         vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
         ::end(drawOps);
    bVar1 = __gnu_cxx::operator!=
                      (&local_438,
                       (__normal_iterator<const_deqp::egl::(anonymous_namespace)::DrawPrimitiveOp_*,_std::vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>_>
                        *)&renderState.restart.restartIndex);
    if (!bVar1) break;
    tcu::TextureLevel::getAccess(&local_5b8,(TextureLevel *)&depthBuffer.m_data.m_cap);
    rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_590,&local_5b8);
    rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess(&local_568,&local_590);
    rr::ViewportState::ViewportState(&local_53c,&local_568);
    rr::RenderState::RenderState((RenderState *)local_524,&local_53c,VIEWPORTORIENTATION_LOWER_LEFT)
    ;
    drawOp_00 = __gnu_cxx::
                __normal_iterator<const_deqp::egl::(anonymous_namespace)::DrawPrimitiveOp_*,_std::vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>_>
                ::operator*(&local_438);
    toReferenceRenderState((RenderState *)local_524,drawOp_00);
    pDVar2 = __gnu_cxx::
             __normal_iterator<const_deqp::egl::(anonymous_namespace)::DrawPrimitiveOp_*,_std::vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>_>
             ::operator->(&local_438);
    attributes[0]._8_8_ =
         std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                   (&pDVar2->positions,0);
    pDVar2 = __gnu_cxx::
             __normal_iterator<const_deqp::egl::(anonymous_namespace)::DrawPrimitiveOp_*,_std::vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>_>
             ::operator->(&local_438);
    attributes[1]._8_8_ =
         std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                   (&pDVar2->colors,0);
    local_6d8 = (FragmentShader *)0x0;
    if (&stack0x00000000 != (undefined1 *)0x188) {
      local_6d8 = (FragmentShader *)
                  &shader.super_VertexShader.m_outputs.
                   super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    rr::Program::Program(&local_600,(VertexShader *)local_188,local_6d8,(GeometryShader *)0x0);
    pDVar2 = __gnu_cxx::
             __normal_iterator<const_deqp::egl::(anonymous_namespace)::DrawPrimitiveOp_*,_std::vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>_>
             ::operator->(&local_438);
    rr::PrimitiveList::PrimitiveList(&local_620,PRIMITIVETYPE_TRIANGLES,pDVar2->count * 3,0);
    rr::DrawCommand::DrawCommand
              (&local_5e8,(RenderState *)local_524,(RenderTarget *)local_340,&local_600,2,
               (VertexAttrib *)
               &shader.super_FragmentShader.m_outputs.
                super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_620);
    rr::Renderer::draw((Renderer *)((long)&attributes[1].generic.v + 0xf),&local_5e8);
    local_628 = (DrawPrimitiveOp *)
                __gnu_cxx::
                __normal_iterator<const_deqp::egl::(anonymous_namespace)::DrawPrimitiveOp_*,_std::vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>_>
                ::operator++(&local_438,0);
  }
  tcu::TextureLevel::getAccess(&local_6a0,(TextureLevel *)&depthBuffer.m_data.m_cap);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_678,&local_6a0);
  rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess(&local_650,&local_678);
  rr::resolveMultisampleColorBuffer(dst,&local_650);
  ReferenceShader::~ReferenceShader((ReferenceShader *)local_188);
  rr::Renderer::~Renderer((Renderer *)((long)&attributes[1].generic.v + 0xf));
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_c0);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_88);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)&depthBuffer.m_data.m_cap);
  return;
}

Assistant:

void renderReference (const tcu::PixelBufferAccess& dst, const vector<DrawPrimitiveOp>& drawOps, const tcu::PixelFormat& colorBits, const int depthBits, const int stencilBits, const int numSamples)
{
	const int						width			= dst.getWidth();
	const int						height			= dst.getHeight();

	tcu::TextureLevel				colorBuffer;
	tcu::TextureLevel				depthBuffer;
	tcu::TextureLevel				stencilBuffer;

	rr::Renderer					referenceRenderer;
	rr::VertexAttrib				attributes[2];
	const ReferenceShader			shader;

	attributes[0].type				= rr::VERTEXATTRIBTYPE_FLOAT;
	attributes[0].size				= 4;
	attributes[0].stride			= 0;
	attributes[0].instanceDivisor	= 0;

	attributes[1].type				= rr::VERTEXATTRIBTYPE_FLOAT;
	attributes[1].size				= 4;
	attributes[1].stride			= 0;
	attributes[1].instanceDivisor	= 0;

	// Initialize buffers.
	colorBuffer.setStorage(getColorFormat(colorBits), numSamples, width, height);
	rr::clearMultisampleColorBuffer(colorBuffer, CLEAR_COLOR, rr::WindowRectangle(0, 0, width, height));

	if (depthBits > 0)
	{
		depthBuffer.setStorage(getDepthFormat(depthBits), numSamples, width, height);
		rr::clearMultisampleDepthBuffer(depthBuffer, CLEAR_DEPTH, rr::WindowRectangle(0, 0, width, height));
	}

	if (stencilBits > 0)
	{
		stencilBuffer.setStorage(getStencilFormat(stencilBits), numSamples, width, height);
		rr::clearMultisampleStencilBuffer(stencilBuffer, CLEAR_STENCIL, rr::WindowRectangle(0, 0, width, height));
	}

	const rr::RenderTarget renderTarget(rr::MultisamplePixelBufferAccess::fromMultisampleAccess(colorBuffer.getAccess()),
										rr::MultisamplePixelBufferAccess::fromMultisampleAccess(depthBuffer.getAccess()),
										rr::MultisamplePixelBufferAccess::fromMultisampleAccess(stencilBuffer.getAccess()));

	for (vector<DrawPrimitiveOp>::const_iterator drawOp = drawOps.begin(); drawOp != drawOps.end(); drawOp++)
	{
		// Translate state
		rr::RenderState renderState((rr::ViewportState)(rr::MultisamplePixelBufferAccess::fromMultisampleAccess(colorBuffer.getAccess())));
		toReferenceRenderState(renderState, *drawOp);

		DE_ASSERT(drawOp->type == PRIMITIVETYPE_TRIANGLE);

		attributes[0].pointer = &drawOp->positions[0];
		attributes[1].pointer = &drawOp->colors[0];

		referenceRenderer.draw(
			rr::DrawCommand(
				renderState,
				renderTarget,
				rr::Program(static_cast<const rr::VertexShader*>(&shader), static_cast<const rr::FragmentShader*>(&shader)),
				2,
				attributes,
				rr::PrimitiveList(rr::PRIMITIVETYPE_TRIANGLES, drawOp->count * 3, 0)));
	}

	rr::resolveMultisampleColorBuffer(dst, rr::MultisamplePixelBufferAccess::fromMultisampleAccess(colorBuffer.getAccess()));
}